

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_io_exception.cpp
# Opt level: O2

char * __thiscall argo::json_io_exception::get_main_message(json_io_exception *this)

{
  uint uVar1;
  
  uVar1 = (this->super_json_exception).m_type - fgetc_failed_e;
  if (uVar1 < 0xf) {
    return &DAT_0011eb74 + *(int *)(&DAT_0011eb74 + (ulong)uVar1 * 4);
  }
  return "generic";
}

Assistant:

const char *json_io_exception::get_main_message()
{
    switch (m_type)
    {
    case fgetc_failed_e:
        return "fgetc() failed";
    case read_failed_e:
        return "read() failed";
    case unexpected_result_from_read_e:
        return "unexpected result from read()";
    case write_fd_failed_e:
        return "write() failed";
    case write_file_failed_e:
        return "fwrite() failed";
    case too_many_put_back_e:
        return "internal error, too many characters put back into a reader";
    case message_too_long_e:
        return "maximum configured message length exceeded";
    case file_open_failed_e:
        return "file open failed";
    default:
        return "generic";
    }
}